

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

size_t bignParamsEnc_internal(octet *der,bign_params *params)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  octet *poVar10;
  size_t sVar11;
  size_t sVar12;
  der_anchor_t *der_00;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  long in_RDI;
  size_t t_13;
  size_t t_12;
  size_t t_11;
  size_t t_10;
  size_t t_9;
  size_t t_8;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  size_t count;
  der_anchor_t CurveSeq [1];
  der_anchor_t FieldSeq [1];
  der_anchor_t ParamSeq [1];
  size_t in_stack_fffffffffffffe98;
  octet *in_stack_fffffffffffffea0;
  der_anchor_t *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  der_anchor_t *in_stack_fffffffffffffeb8;
  der_anchor_t *anchor;
  size_t in_stack_fffffffffffffec0;
  octet *pos;
  octet *in_stack_fffffffffffffec8;
  octet *der_01;
  undefined8 in_stack_fffffffffffffed0;
  u32 uVar16;
  octet *in_stack_fffffffffffffed8;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  
  uVar16 = (u32)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  sVar1 = derTSEQEncStart(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98,0);
  if (in_RDI == 0) {
    local_f8 = 0;
  }
  else {
    local_f8 = in_RDI + sVar1;
  }
  sVar2 = derTSIZEEnc(in_stack_fffffffffffffed8,uVar16,(size_t)in_stack_fffffffffffffec8);
  if (local_f8 == 0) {
    local_100 = 0;
  }
  else {
    local_100 = local_f8 + sVar2;
  }
  sVar3 = derTSEQEncStart(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98,0);
  if (local_100 == 0) {
    local_108 = 0;
  }
  else {
    local_108 = local_100 + sVar3;
  }
  sVar4 = derOIDEnc((octet *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (local_108 == 0) {
    local_110 = 0;
  }
  else {
    local_110 = local_108 + sVar4;
  }
  sVar5 = derTUINTEnc(in_stack_fffffffffffffec8,(u32)(in_stack_fffffffffffffec0 >> 0x20),
                      (octet *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  if (local_110 == 0) {
    local_118 = 0;
  }
  else {
    local_118 = local_110 + sVar5;
  }
  sVar6 = derTSEQEncStop(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
  uVar16 = (u32)(in_stack_fffffffffffffec0 >> 0x20);
  if (local_118 == 0) {
    local_120 = 0;
  }
  else {
    local_120 = local_118 + sVar6;
  }
  sVar7 = derTSEQEncStart(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98,0);
  if (local_120 == 0) {
    local_120 = 0;
  }
  else {
    local_120 = local_120 + sVar7;
  }
  sVar8 = derEnc((octet *)in_stack_fffffffffffffeb8,(u32)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                 in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
  if (local_120 == 0) {
    local_120 = 0;
  }
  else {
    local_120 = local_120 + sVar8;
  }
  sVar9 = derEnc((octet *)in_stack_fffffffffffffeb8,(u32)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                 in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
  if (local_120 == 0) {
    poVar10 = (octet *)0x0;
  }
  else {
    poVar10 = (octet *)(local_120 + sVar9);
  }
  der_01 = poVar10;
  sVar11 = derTBITEnc(poVar10,uVar16,(octet *)in_stack_fffffffffffffeb8,
                      (size_t)in_stack_fffffffffffffeb0);
  uVar16 = (u32)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  if (poVar10 == (octet *)0x0) {
    poVar10 = (octet *)0x0;
  }
  else {
    poVar10 = poVar10 + sVar11;
  }
  pos = poVar10;
  sVar12 = derTSEQEncStop(der_01,(size_t)poVar10,in_stack_fffffffffffffeb8);
  if (poVar10 == (octet *)0x0) {
    der_00 = (der_anchor_t *)0x0;
  }
  else {
    der_00 = (der_anchor_t *)(poVar10 + sVar12);
  }
  anchor = der_00;
  sVar13 = derEnc((octet *)der_00,uVar16,in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0
                 );
  if (der_00 == (der_anchor_t *)0x0) {
    poVar10 = (octet *)0x0;
  }
  else {
    poVar10 = (octet *)((long)&der_00->der + sVar13);
  }
  sVar14 = derTUINTEnc(der_01,(u32)((ulong)pos >> 0x20),(octet *)anchor,(size_t)poVar10);
  sVar15 = derTSEQEncStop(der_01,(size_t)pos,anchor);
  return sVar15 + sVar14 + sVar13 + sVar12 + sVar11 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 
                                                  + sVar3 + sVar2 + sVar1;
}

Assistant:

static size_t bignParamsEnc_internal(octet der[], const bign_params* params)
{
	der_anchor_t ParamSeq[1];
	der_anchor_t FieldSeq[1];
	der_anchor_t CurveSeq[1];
	size_t count = 0;
	// начать кодирование...
	derEncStep(derSEQEncStart(ParamSeq, der, count), der, count);
	 // ...version...
	 derEncStep(derSIZEEnc(der, 1), der, count);
	 // ...FieldID...
	 derEncStep(derSEQEncStart(FieldSeq, der, count), der, count);
	  derEncStep(derOIDEnc(der, oid_bign_primefield), der, count);
	  derEncStep(derUINTEnc(der, params->p, params->l / 4), der, count);
	 derEncStep(derSEQEncStop(der, count, FieldSeq), der, count);
	 // ...Curve...
	 derEncStep(derSEQEncStart(CurveSeq, der, count), der, count);
	  derEncStep(derOCTEnc(der, params->a, params->l / 4), der, count);
	  derEncStep(derOCTEnc(der, params->b, params->l / 4), der, count);
	  derEncStep(derBITEnc(der, params->seed, 64), der, count);
	 derEncStep(derSEQEncStop(der, count, CurveSeq), der, count);
	 // ...base...
	 derEncStep(derOCTEnc(der, params->yG, params->l / 4), der, count);
	 // ...order...
	 derEncStep(derUINTEnc(der, params->q, params->l / 4), der, count);
	 // ...завершить кодирование
	derEncStep(derSEQEncStop(der, count, ParamSeq), der, count);
	// возвратить длину DER-кода
	return count;
}